

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShrS
          (I64ToI32Lowering *this,Index highBits,Index leftHigh,Index shift)

{
  Builder *this_00;
  Builder *this_01;
  LocalGet *pLVar1;
  Const *right;
  Binary *pBVar2;
  LocalSet *any;
  LocalGet *right_00;
  Block *pBVar3;
  
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar1 = Builder::makeLocalGet(this_00,leftHigh,(Type)0x2);
  right = Builder::makeConst<int>
                    ((this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
  pBVar2 = Builder::makeBinary(this_00,ShrSInt32,(Expression *)pLVar1,(Expression *)right);
  any = Builder::makeLocalSet(this_00,highBits,(Expression *)pBVar2);
  this_01 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar1 = Builder::makeLocalGet(this_01,leftHigh,(Type)0x2);
  right_00 = Builder::makeLocalGet
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,shift,(Type)0x2)
  ;
  pBVar2 = Builder::makeBinary(this_01,ShrSInt32,(Expression *)pLVar1,(Expression *)right_00);
  pBVar3 = Builder::blockify(this_00,(Expression *)any,(Expression *)pBVar2);
  return pBVar3;
}

Assistant:

Block* makeLargeShrS(Index highBits, Index leftHigh, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeConst(int32_t(31)))),
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }